

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::details::
send_extended_length_message<unsigned_short,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,details *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,frame_fixed_layout *f,span<const_unsigned_char,__1L> *span)

{
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  frame_fixed_layout *pfVar1;
  anon_class_16_2_52d05704 f_00;
  anon_class_16_2_9095cc0e f_01;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eStack_58;
  undefined1 local_40 [24];
  char local_28;
  
  io_00._M_data._2_6_ = 0;
  io_00._M_data._0_2_ = (ushort)(io._M_data)->fd_;
  pfVar1 = f;
  local_40._0_8_ = this;
  send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short,void>
            ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
              *)(local_40 + 8),(http *)this,sender,io_00,(unsigned_short)f);
  f_00.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                 **)pfVar1;
  f_00.span = (span<const_unsigned_char,__1L> *)local_40;
  pstore::operator>>=(&eStack_58,(pstore *)(local_40 + 8),
                      (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                       *)&f->payload_length,f_00);
  f_01.span = (span<const_unsigned_char,__1L> *)pfVar1;
  f_01.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                 **)f;
  pstore::operator>>=(__return_storage_ptr__,(pstore *)&eStack_58,
                      (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                       *)local_40,f_01);
  if (eStack_58.has_error_ == false) {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&eStack_58);
  }
  else {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
              (&eStack_58);
  }
  if (local_28 == '\0') {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)(local_40 + 8));
  }
  else {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)(local_40 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_extended_length_message (Sender sender, IO io,
                                                       frame_fixed_layout const & f,
                                                       gsl::span<std::uint8_t const> const & span) {
                auto send_length = [&] (IO io2) {
                    auto const size = span.size ();
                    PSTORE_ASSERT (
                        size >= 0 &&
                        static_cast<
                            std::make_unsigned<std::remove_const<decltype (size)>::type>::type> (
                            size) <= std::numeric_limits<LengthType>::max ());
                    return send (sender, io2, static_cast<LengthType> (size));
                };
                auto send_payload = [&] (IO io3) { return send (sender, io3, span); };

                return (send (sender, io, f.raw) >>= send_length) >>= send_payload;
            }